

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_getfenv(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  TValue *o_1;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if ((pTVar2->field_2).it == 0xfffffff7) {
    pTVar1 = in_RDI->top;
    (pTVar1->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(pTVar2->u32).lo + 8);
    (pTVar1->field_2).it = 0xfffffff4;
  }
  else if ((pTVar2->field_2).it == 0xfffffff3) {
    pTVar1 = in_RDI->top;
    (pTVar1->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(pTVar2->u32).lo + 8);
    (pTVar1->field_2).it = 0xfffffff4;
  }
  else if ((pTVar2->field_2).it == 0xfffffff9) {
    pTVar1 = in_RDI->top;
    (pTVar1->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(pTVar2->u32).lo + 0x2c);
    (pTVar1->field_2).it = 0xfffffff4;
  }
  else {
    (in_RDI->top->field_2).it = 0xffffffff;
  }
  pTVar2 = in_RDI->top;
  in_RDI->top = pTVar2 + 1;
  if ((TValue *)(ulong)(in_RDI->maxstack).ptr32 <= pTVar2 + 1) {
    lj_state_growstack1((lua_State *)0x112946);
  }
  return;
}

Assistant:

LUA_API void lua_getfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  if (tvisfunc(o)) {
    settabV(L, L->top, tabref(funcV(o)->c.env));
  } else if (tvisudata(o)) {
    settabV(L, L->top, tabref(udataV(o)->env));
  } else if (tvisthread(o)) {
    settabV(L, L->top, tabref(threadV(o)->env));
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}